

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor * ggml_get_rows(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b)

{
  ggml_tensor *pgVar1;
  char *pcVar2;
  ggml_type type;
  int line;
  int64_t local_38;
  int64_t local_30;
  long local_28;
  int64_t local_20;
  
  local_28 = a->ne[2];
  if (local_28 == b->ne[1]) {
    if (b->ne[3] == 1) {
      if (b->type == GGML_TYPE_I32) {
        type = a->type;
        if (type != GGML_TYPE_I32) {
          type = GGML_TYPE_F32;
        }
        local_38 = a->ne[0];
        local_30 = b->ne[0];
        local_20 = b->ne[2];
        pgVar1 = ggml_new_tensor_impl(ctx,type,4,&local_38,(ggml_tensor *)0x0,0);
        pgVar1->op = GGML_OP_GET_ROWS;
        pgVar1->src[0] = a;
        pgVar1->src[1] = b;
        return pgVar1;
      }
      pcVar2 = "b->type == GGML_TYPE_I32";
      line = 0xd01;
    }
    else {
      pcVar2 = "b->ne[3] == 1";
      line = 0xd00;
    }
  }
  else {
    pcVar2 = "a->ne[2] == b->ne[1]";
    line = 0xcff;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c",
             line,"GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

struct ggml_tensor * ggml_get_rows(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b) {
    GGML_ASSERT(a->ne[2] == b->ne[1]);
    GGML_ASSERT(b->ne[3] == 1);
    GGML_ASSERT(b->type == GGML_TYPE_I32);

    // TODO: implement non F32 return
    enum ggml_type type = GGML_TYPE_F32;
    if (a->type == GGML_TYPE_I32) {
        type = a->type;
    }
    struct ggml_tensor * result = ggml_new_tensor_4d(ctx, type, a->ne[0], b->ne[0], b->ne[1], b->ne[2]);

    result->op     = GGML_OP_GET_ROWS;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}